

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-rule-storage.c
# Opt level: O3

int ndn_rule_storage_remove_rule(char *rule_name)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ndn_rule_name_t *__s1;
  long lVar4;
  
  __s1 = ndn_rule_storage.rule_names;
  lVar4 = 0;
  do {
    iVar1 = strcmp(__s1->name,rule_name);
    if (iVar1 == 0) {
      sVar2 = strlen(__s1->name);
      sVar3 = strlen(rule_name);
      if (sVar2 == sVar3) {
        memset(ndn_rule_storage.rule_objects[0].data_pattern.components[0].value + lVar4 + -4,0,
               0x4c0);
        __s1->name[0] = '\0';
        return 0;
      }
    }
    lVar4 = lVar4 + 0x4c0;
    __s1 = __s1 + 1;
  } while (lVar4 != 0x17c0);
  return 0;
}

Assistant:

int
ndn_rule_storage_remove_rule(const char *rule_name)
{
  for (int i = 0; i < NDN_TRUST_SCHEMA_MAX_SUBPATTERN_MATCHES; i++) {
    if (strcmp((const char *)&ndn_rule_storage.rule_names[i].name, rule_name) == 0
        && strlen((const char *)&ndn_rule_storage.rule_names[i].name) == strlen(rule_name)) {
      memset(&ndn_rule_storage.rule_objects[i], 0, sizeof(ndn_trust_schema_rule_t));
      ndn_rule_storage.rule_names[i].name[0] = '\0';
      return NDN_SUCCESS;
    }
  }
  return NDN_SUCCESS;
}